

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::KNearestNeighborsClassifier::_InternalParse
          (KNearestNeighborsClassifier *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  internal *this_00;
  size_t size;
  bool bVar4;
  uint uVar5;
  NearestNeighborsIndex *msg;
  string *s;
  char cVar6;
  uint res;
  uint32_t res32;
  undefined8 *puVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *field_name;
  Arena *pAVar8;
  InternalMetadata *this_01;
  pair<const_char_*,_unsigned_int> pVar9;
  pair<const_char_*,_unsigned_long> pVar10;
  StringPiece str;
  byte *local_40;
  InternalMetadata *local_38;
  
  local_40 = (byte *)ptr;
  bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
  if (!bVar4) {
    this_01 = &(this->super_MessageLite)._internal_metadata_;
    local_38 = this_01;
    do {
      bVar1 = *local_40;
      res = (uint)bVar1;
      field_name = local_40 + 1;
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*field_name * 0x80) - 0x80;
        if ((char)*field_name < '\0') {
          pVar9 = google::protobuf::internal::ReadTagFallback((char *)local_40,res);
          field_name = (byte *)pVar9.first;
          res = pVar9.second;
        }
        else {
          field_name = local_40 + 2;
        }
      }
      uVar5 = res >> 3;
      cVar6 = (char)res;
      local_40 = field_name;
      if (uVar5 < 0x6e) {
        if (uVar5 < 100) {
          if (uVar5 == 1) {
            if (cVar6 == '\n') {
              msg = this->nearestneighborsindex_;
              if (msg == (NearestNeighborsIndex *)0x0) {
                pAVar8 = (Arena *)(this_01->ptr_ & 0xfffffffffffffffc);
                if ((this_01->ptr_ & 1U) != 0) {
                  pAVar8 = *(Arena **)pAVar8;
                }
                msg = google::protobuf::Arena::
                      CreateMaybeMessage<CoreML::Specification::NearestNeighborsIndex>(pAVar8);
                this->nearestneighborsindex_ = msg;
              }
              goto LAB_00231b78;
            }
          }
          else if ((uVar5 == 3) && (cVar6 == '\x1a')) {
            msg = (NearestNeighborsIndex *)this->numberofneighbors_;
            if (msg == (NearestNeighborsIndex *)0x0) {
              pAVar8 = (Arena *)(this_01->ptr_ & 0xfffffffffffffffc);
              if ((this_01->ptr_ & 1U) != 0) {
                pAVar8 = *(Arena **)pAVar8;
              }
              msg = (NearestNeighborsIndex *)
                    google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::Int64Parameter>(pAVar8);
              this->numberofneighbors_ = (Int64Parameter *)msg;
            }
LAB_00231b78:
            local_40 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                         (ctx,&msg->super_MessageLite,(char *)local_40);
            goto joined_r0x00231b8b;
          }
        }
        else if (uVar5 == 100) {
          if (cVar6 == '\"') {
            if (this->_oneof_case_[0] == 100) goto LAB_00231ab7;
            clear_ClassLabels(this);
            this->_oneof_case_[0] = 100;
            uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
            pAVar8 = (Arena *)(uVar3 & 0xfffffffffffffffc);
            if ((uVar3 & 1) != 0) {
              pAVar8 = *(Arena **)pAVar8;
            }
            msg = (NearestNeighborsIndex *)
                  google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                            (pAVar8);
            goto LAB_00231b3b;
          }
        }
        else if ((uVar5 == 0x65) && (cVar6 == '*')) {
          if (this->_oneof_case_[0] == 0x65) {
LAB_00231ab7:
            msg = (NearestNeighborsIndex *)(this->ClassLabels_).stringclasslabels_;
            goto LAB_00231b78;
          }
          clear_ClassLabels(this);
          this->_oneof_case_[0] = 0x65;
          uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
          pAVar8 = (Arena *)(uVar3 & 0xfffffffffffffffc);
          if ((uVar3 & 1) != 0) {
            pAVar8 = *(Arena **)pAVar8;
          }
          msg = (NearestNeighborsIndex *)
                google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Vector>
                          (pAVar8);
LAB_00231b3b:
          (this->ClassLabels_).int64classlabels_ = (Int64Vector *)msg;
          goto LAB_00231b78;
        }
LAB_00231ad9:
        if ((res == 0) || ((res & 7) == 4)) {
          if (field_name == (byte *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
          return (char *)field_name;
        }
        if ((this_01->ptr_ & 1U) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(this_01);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((this_01->ptr_ & 0xfffffffffffffffcU) + 8);
        }
        local_40 = (byte *)google::protobuf::internal::UnknownFieldParse
                                     (res,unknown,(char *)local_40,ctx);
      }
      else {
        if (199 < uVar5) {
          if (uVar5 == 200) {
            if (cVar6 == 'B') {
              if (this->_oneof_case_[2] == 200) goto LAB_00231ad0;
              clear_WeightingScheme(this);
              this->_oneof_case_[2] = 200;
              uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
              pAVar8 = (Arena *)(uVar3 & 0xfffffffffffffffc);
              if ((uVar3 & 1) != 0) {
                pAVar8 = *(Arena **)pAVar8;
              }
              msg = (NearestNeighborsIndex *)
                    google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::UniformWeighting>(pAVar8);
              goto LAB_00231b6c;
            }
          }
          else if ((uVar5 == 0xd2) && (cVar6 == -0x6e)) {
            if (this->_oneof_case_[2] == 0xd2) {
LAB_00231ad0:
              msg = (NearestNeighborsIndex *)(this->WeightingScheme_).uniformweighting_;
              goto LAB_00231b78;
            }
            clear_WeightingScheme(this);
            this->_oneof_case_[2] = 0xd2;
            uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
            pAVar8 = (Arena *)(uVar3 & 0xfffffffffffffffc);
            if ((uVar3 & 1) != 0) {
              pAVar8 = *(Arena **)pAVar8;
            }
            msg = (NearestNeighborsIndex *)
                  google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::InverseDistanceWeighting>(pAVar8);
LAB_00231b6c:
            (this->WeightingScheme_).inversedistanceweighting_ = (InverseDistanceWeighting *)msg;
            goto LAB_00231b78;
          }
          goto LAB_00231ad9;
        }
        if (uVar5 == 0x6e) {
          if (cVar6 != 'r') goto LAB_00231ad9;
          if (this->_oneof_case_[1] != 0x6e) {
            clear_DefaultClassLabel(this);
            this->_oneof_case_[1] = 0x6e;
            (this->DefaultClassLabel_).defaultint64label_ =
                 (int64_t)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
          }
          puVar7 = (undefined8 *)(this_01->ptr_ & 0xfffffffffffffffc);
          if ((this_01->ptr_ & 1U) != 0) {
            puVar7 = (undefined8 *)*puVar7;
          }
          s = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_
                        ((ArenaStringPtr *)&this->DefaultClassLabel_,puVar7);
          local_40 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                       (s,(char *)local_40,ctx);
          this_00 = (internal *)(s->_M_dataplus)._M_p;
          size = s->_M_string_length;
          if ((long)size < 0) {
            google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
                      (size,"string length exceeds max size");
          }
          str.length_ = 0;
          str.ptr_ = (char *)size;
          bVar4 = google::protobuf::internal::VerifyUTF8(this_00,str,(char *)field_name);
          this_01 = local_38;
          if (!bVar4) {
            return (char *)0x0;
          }
        }
        else {
          if ((uVar5 != 0x6f) || (cVar6 != 'x')) goto LAB_00231ad9;
          bVar1 = *field_name;
          pVar10.second = (long)(char)bVar1;
          pVar10.first = (char *)(field_name + 1);
          if ((long)(char)bVar1 < 0) {
            bVar2 = field_name[1];
            res32 = ((uint)bVar2 * 0x80 + (uint)bVar1) - 0x80;
            if ((char)bVar2 < '\0') {
              pVar10 = google::protobuf::internal::VarintParseSlow64((char *)field_name,res32);
            }
            else {
              pVar10.second._0_4_ = res32;
              pVar10.first = (char *)(field_name + 2);
              pVar10.second._4_4_ = 0;
            }
          }
          local_40 = (byte *)pVar10.first;
          if (this->_oneof_case_[1] != 0x6f) {
            clear_DefaultClassLabel(this);
            this->_oneof_case_[1] = 0x6f;
          }
          (this->DefaultClassLabel_).defaultint64label_ = pVar10.second;
        }
      }
joined_r0x00231b8b:
      if (local_40 == (byte *)0x0) {
        return (char *)0x0;
      }
      bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
    } while (!bVar4);
  }
  return (char *)local_40;
}

Assistant:

const char* KNearestNeighborsClassifier::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // .CoreML.Specification.NearestNeighborsIndex nearestNeighborsIndex = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ctx->ParseMessage(_internal_mutable_nearestneighborsindex(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64Parameter numberOfNeighbors = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_numberofneighbors(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_stringclasslabels(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_int64classlabels(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string defaultStringLabel = 110;
      case 110:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 114)) {
          auto str = _internal_mutable_defaultstringlabel();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int64 defaultInt64Label = 111;
      case 111:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 120)) {
          _internal_set_defaultint64label(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.UniformWeighting uniformWeighting = 200;
      case 200:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 66)) {
          ptr = ctx->ParseMessage(_internal_mutable_uniformweighting(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.InverseDistanceWeighting inverseDistanceWeighting = 210;
      case 210:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 146)) {
          ptr = ctx->ParseMessage(_internal_mutable_inversedistanceweighting(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}